

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O3

void Acec_TreeFilterOne(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vTree)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  int *piVar5;
  byte bVar6;
  void *__ptr;
  void *__s;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  size_t __size;
  Gia_Obj_t *pGVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  
  uVar20 = p->nObjs;
  iVar18 = (((int)uVar20 >> 5) + 1) - (uint)((uVar20 & 0x1f) == 0);
  if (iVar18 == 0) {
    __ptr = (void *)0x0;
    __size = 0;
    __s = (void *)0x0;
  }
  else {
    __size = (long)iVar18 << 2;
    __ptr = calloc(1,__size);
    __s = malloc(__size);
  }
  uVar19 = iVar18 * 0x20;
  memset(__s,0,__size);
  iVar18 = vTree->nSize;
  if (1 < iVar18) {
    piVar4 = vTree->pArray;
    lVar17 = 0;
    do {
      iVar2 = piVar4[lVar17];
      if (iVar2 < 0) goto LAB_00685b5f;
      uVar8 = iVar2 * 6 + 3;
      uVar9 = vAdds->nSize;
      if ((int)uVar9 <= (int)uVar8) goto LAB_00685b5f;
      piVar5 = vAdds->pArray;
      uVar8 = piVar5[uVar8];
      if (((int)uVar8 < 0) || ((int)uVar19 <= (int)uVar8)) goto LAB_00685b7e;
      puVar1 = (uint *)((long)__ptr + (ulong)(uVar8 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar8 & 0x1f);
      uVar8 = iVar2 * 6 + 4;
      if (uVar9 <= uVar8) goto LAB_00685b5f;
      uVar9 = piVar5[uVar8];
      if (((int)uVar9 < 0) || (uVar19 <= uVar9)) goto LAB_00685b7e;
      puVar1 = (uint *)((long)__ptr + (ulong)(uVar9 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar9 & 0x1f);
      iVar2 = (int)lVar17;
      lVar17 = lVar17 + 2;
    } while (iVar2 + 3 < iVar18);
    if (1 < iVar18) {
      piVar4 = vTree->pArray;
      lVar17 = 0;
      do {
        iVar2 = piVar4[lVar17];
        if (iVar2 < 0) goto LAB_00685b5f;
        uVar8 = iVar2 * 6;
        uVar9 = vAdds->nSize;
        if (uVar9 == uVar8 || SBORROW4(uVar9,uVar8) != (int)(uVar9 + iVar2 * -6) < 0)
        goto LAB_00685b5f;
        piVar5 = vAdds->pArray;
        uVar11 = piVar5[uVar8];
        if (((int)uVar11 < 0) || ((int)uVar19 <= (int)uVar11)) goto LAB_00685b7e;
        bVar6 = (byte)uVar11 & 0x1f;
        puVar1 = (uint *)((long)__ptr + (ulong)(uVar11 >> 5) * 4);
        *puVar1 = *puVar1 & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
        if (uVar9 <= (uVar8 | 1)) goto LAB_00685b5f;
        uVar11 = piVar5[uVar8 | 1];
        if (((int)uVar11 < 0) || (uVar19 <= uVar11)) goto LAB_00685b7e;
        bVar6 = (byte)uVar11 & 0x1f;
        puVar1 = (uint *)((long)__ptr + (ulong)(uVar11 >> 5) * 4);
        *puVar1 = *puVar1 & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
        if (uVar9 <= uVar8 + 2) goto LAB_00685b5f;
        uVar9 = piVar5[uVar8 + 2];
        if (((int)uVar9 < 0) || (uVar19 <= uVar9)) goto LAB_00685b7e;
        bVar6 = (byte)uVar9 & 0x1f;
        puVar1 = (uint *)((long)__ptr + (ulong)(uVar9 >> 5) * 4);
        *puVar1 = *puVar1 & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
        iVar2 = (int)lVar17;
        lVar17 = lVar17 + 2;
      } while (iVar2 + 3 < iVar18);
    }
  }
  if ((0 < (int)uVar20) && (pGVar13 = p->pObjs, pGVar13 != (Gia_Obj_t *)0x0)) {
    uVar7 = 0;
    do {
      uVar9 = (uint)*(undefined8 *)pGVar13;
      if ((~uVar9 & 0x1fffffff) != 0 && -1 < (int)uVar9) {
        uVar10 = -(uVar9 & 0x1fffffff) + uVar7;
        uVar9 = (uint)uVar10;
        if (((int)uVar9 < 0) || ((int)uVar19 <= (int)uVar9)) goto LAB_00685b9d;
        uVar14 = uVar10 >> 5 & 0x7ffffff;
        if ((*(uint *)((long)__ptr + uVar14 * 4) >> (uVar9 & 0x1f) & 1) == 0) {
          uVar12 = -((uint)((ulong)*(undefined8 *)pGVar13 >> 0x20) & 0x1fffffff) + uVar7;
          uVar9 = (uint)uVar12;
          if (((int)uVar9 < 0) || (uVar19 <= uVar9)) goto LAB_00685b9d;
          uVar16 = uVar12 >> 5 & 0x7ffffff;
          if (((*(uint *)((long)__ptr + uVar16 * 4) >> (uVar9 & 0x1f) & 1) == 0) &&
             (((*(uint *)((long)__s + uVar14 * 4) & 1 << ((byte)uVar10 & 0x1f)) == 0 &&
              ((*(uint *)((long)__s + uVar16 * 4) & 1 << ((byte)uVar12 & 0x1f)) == 0))))
          goto LAB_006859d4;
        }
        if (uVar19 <= uVar7) {
LAB_00685b7e:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                        ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
        }
        puVar1 = (uint *)((long)__s + (uVar7 >> 5 & 0x7ffffff) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)uVar7 & 0x1f);
      }
LAB_006859d4:
      uVar7 = uVar7 + 1;
      pGVar13 = pGVar13 + 1;
    } while (uVar20 != uVar7);
  }
  uVar20 = 0;
  if (1 < iVar18) {
    lVar17 = 1;
    uVar20 = 0;
    do {
      piVar4 = vTree->pArray;
      uVar9 = piVar4[lVar17 + -1];
      if ((int)uVar9 < 0) {
LAB_00685b5f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar11 = uVar9 * 6 + 3;
      uVar8 = vAdds->nSize;
      if ((int)uVar8 <= (int)uVar11) goto LAB_00685b5f;
      piVar5 = vAdds->pArray;
      uVar11 = piVar5[uVar11];
      if (((int)uVar11 < 0) || ((int)uVar19 <= (int)uVar11)) goto LAB_00685b9d;
      iVar2 = piVar4[lVar17];
      uVar15 = uVar9 * 6 + 4;
      if ((*(uint *)((long)__s + (ulong)(uVar11 >> 5) * 4) >> (uVar11 & 0x1f) & 1) == 0) {
        if (uVar8 <= uVar15) goto LAB_00685b5f;
        uVar3 = piVar5[uVar15];
        if (((int)uVar3 < 0) || (uVar19 <= uVar3)) {
LAB_00685b9d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if ((*(uint *)((long)__s + (ulong)(uVar3 >> 5) * 4) >> (uVar3 & 0x1f) & 1) != 0)
        goto LAB_00685ab6;
        if (((int)uVar20 < 0) || (iVar18 <= (int)uVar20)) {
LAB_00685bbc:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar8 = uVar20 + 1;
        piVar4[uVar20] = uVar9;
        if (vTree->nSize <= (int)uVar8) goto LAB_00685bbc;
        uVar20 = uVar20 + 2;
        piVar4[uVar8] = iVar2;
      }
      else {
LAB_00685ab6:
        if (uVar8 <= uVar15) goto LAB_00685b5f;
        printf("Removing box %d=(%d,%d) of rank %d.\n",(ulong)uVar9,(ulong)uVar11,
               (ulong)(uint)piVar5[uVar15]);
      }
      iVar18 = vTree->nSize;
      lVar17 = lVar17 + 2;
    } while ((int)lVar17 < iVar18);
  }
  if (iVar18 < (int)uVar20) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  vTree->nSize = uVar20;
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (__s == (void *)0x0) {
    return;
  }
  free(__s);
  return;
}

Assistant:

void Acec_TreeFilterOne( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vTree )
{
    Vec_Bit_t * vIsRoot = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Bit_t * vMarked = Vec_BitStart( Gia_ManObjNum(p) ) ;
    Gia_Obj_t * pObj;
    int i, k = 0, Box, Rank;
    // mark roots
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+3), 1 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+4), 1 );
    }
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+0), 0 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+1), 0 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+2), 0 );
    }
    // iterate through nodes to detect TFO of roots
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Vec_BitEntry(vIsRoot, Gia_ObjFaninId0(pObj,i)) || Vec_BitEntry(vIsRoot, Gia_ObjFaninId1(pObj,i)) ||
             Vec_BitEntry(vMarked, Gia_ObjFaninId0(pObj,i)) || Vec_BitEntry(vMarked, Gia_ObjFaninId1(pObj,i)) )
            Vec_BitWriteEntry( vMarked, i, 1 );
    }
    // remove those that overlap with roots
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        // special case of the first bit
//        if ( i == 0 )
//            continue;

/*
        if ( Vec_IntEntry(vAdds, 6*Box+3) == 24 && Vec_IntEntry(vAdds, 6*Box+4) == 22 )
        {
            printf( "**** removing special one \n" );
            continue;
        }
        if ( Vec_IntEntry(vAdds, 6*Box+3) == 48 && Vec_IntEntry(vAdds, 6*Box+4) == 49 )
        {
            printf( "**** removing special one \n" );
            continue;
        }
*/
        if ( Vec_BitEntry(vMarked, Vec_IntEntry(vAdds, 6*Box+3)) || Vec_BitEntry(vMarked, Vec_IntEntry(vAdds, 6*Box+4)) )
        {
            printf( "Removing box %d=(%d,%d) of rank %d.\n", Box, Vec_IntEntry(vAdds, 6*Box+3), Vec_IntEntry(vAdds, 6*Box+4), Rank ); 
            continue;
        }
        Vec_IntWriteEntry( vTree, k++, Box );
        Vec_IntWriteEntry( vTree, k++, Rank );
    }
    Vec_IntShrink( vTree, k );
    Vec_BitFree( vIsRoot );
    Vec_BitFree( vMarked );
}